

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O1

bool __thiscall
tlx::CmdlineParser::ArgumentStringlist::process(ArgumentStringlist *this,int *argc,char ***argv)

{
  int iVar1;
  
  iVar1 = *argc;
  if (iVar1 != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->dest_,
               *argv);
    *argc = *argc + -1;
    *argv = *argv + 1;
  }
  return iVar1 != 0;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        dest_.emplace_back(argv[0]);
        --argc, ++argv;
        return true;
    }